

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

bool getComplementarityViolations
               (HighsLp *lp,HighsSolution *solution,double *max_complementarity_violation,
               double *sum_complementarity_violations)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  
  *max_complementarity_violation = INFINITY;
  *sum_complementarity_violations = INFINITY;
  bVar3 = solution->dual_valid;
  if (bVar3 == true) {
    *max_complementarity_violation = 0.0;
    *sum_complementarity_violations = 0.0;
    iVar4 = lp->num_col_;
    lVar7 = (long)iVar4;
    uVar9 = lp->num_row_ + iVar4;
    if (uVar9 != 0 && SCARRY4(lp->num_row_,iVar4) == (int)uVar9 < 0) {
      lVar10 = lVar7 * -8;
      lVar11 = 0;
      uVar6 = 0;
      do {
        pdVar12 = (double *)
                  ((long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar10);
        if ((long)uVar6 < lVar7) {
          pdVar12 = (double *)
                    ((long)(solution->col_value).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11);
        }
        dVar13 = *pdVar12;
        pdVar8 = (double *)
                 ((long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar10);
        pdVar12 = (double *)
                  ((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar10);
        pdVar5 = (double *)
                 ((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar10);
        if ((long)uVar6 < lVar7) {
          pdVar8 = (double *)
                   ((long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar11);
          pdVar12 = (double *)
                    ((long)(solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar11);
          pdVar5 = (double *)
                   ((long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar11);
        }
        dVar1 = *pdVar5;
        dVar2 = *pdVar8;
        if ((-INFINITY < dVar1) || (dVar14 = 1.0, dVar2 < INFINITY)) {
          if ((dVar1 + dVar2) * 0.5 <= dVar13) {
            dVar14 = ABS(dVar2 - dVar13);
          }
          else {
            dVar14 = ABS(dVar1 - dVar13);
          }
        }
        dVar14 = ABS(*pdVar12) * dVar14;
        *sum_complementarity_violations = *sum_complementarity_violations + dVar14;
        dVar13 = *max_complementarity_violation;
        if (*max_complementarity_violation <= dVar14) {
          dVar13 = dVar14;
        }
        *max_complementarity_violation = dVar13;
        uVar6 = uVar6 + 1;
        lVar10 = lVar10 + 8;
        lVar11 = lVar11 + 8;
      } while (uVar9 != uVar6);
    }
  }
  return bVar3;
}

Assistant:

bool getComplementarityViolations(const HighsLp& lp,
                                  const HighsSolution& solution,
                                  double& max_complementarity_violation,
                                  double& sum_complementarity_violations) {
  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;
  if (!solution.dual_valid) return false;

  max_complementarity_violation = 0;
  sum_complementarity_violations = 0;
  double primal_residual = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      primal_residual = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      primal_residual =
          primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    }
    const double dual_residual = std::fabs(dual);
    const double complementarity_violation = primal_residual * dual_residual;
    sum_complementarity_violations += complementarity_violation;
    max_complementarity_violation =
        std::max(complementarity_violation, max_complementarity_violation);
  }
  return true;
}